

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O0

double IKatan2(double fy,double fx)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *this;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  double local_20;
  double fx_local;
  double fy_local;
  
  local_20 = fx;
  fx_local = fy;
  uVar1 = std::isnan(fy);
  if ((uVar1 & 1) == 0) {
    uVar1 = std::isnan(local_20);
    if ((uVar1 & 1) == 0) {
      fy_local = atan2(fx_local,local_20);
    }
    else {
      fy_local = 0.0;
    }
  }
  else {
    uVar1 = std::isnan(local_20);
    if ((uVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar2 = std::operator<<(local_198,"ikfast exception: ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/src/abb_irb4600_40_255/ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc2);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"IKatan2");
      poVar2 = std::operator<<(poVar2,": Assertion \'");
      poVar2 = std::operator<<(poVar2,"!isnan(fx)");
      std::operator<<(poVar2,"\' failed");
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this,local_1d8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fy_local = 1.5707963267949;
  }
  return fy_local;
}

Assistant:

inline double IKatan2(double fy, double fx) {
    if( isnan(fy) ) {
        IKFAST_ASSERT(!isnan(fx)); // if both are nan, probably wrong value will be returned
        return IKPI_2;
    }
    else if( isnan(fx) ) {
        return 0;
    }
    return atan2(fy,fx);
}